

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_union.cc
# Opt level: O0

bool __thiscall S2CellUnion::IsNormalized(S2CellUnion *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  S2CellId a;
  S2CellId b;
  S2CellId c;
  S2CellId d;
  bool local_7d;
  byte local_6d;
  S2CellId local_4c;
  uint64 local_44;
  S2CellId local_3c;
  S2CellId local_34;
  S2CellId local_2c;
  int local_24;
  S2CellId SStack_20;
  int i;
  S2CellUnion *local_18;
  S2CellUnion *this_local;
  
  local_18 = this;
  iVar2 = num_cells(this);
  local_6d = 0;
  if (0 < iVar2) {
    SStack_20 = cell_id(this,0);
    bVar1 = S2CellId::is_valid(&stack0xffffffffffffffe0);
    local_6d = bVar1 ^ 0xff;
  }
  if ((local_6d & 1) == 0) {
    for (local_24 = 1; iVar2 = local_24, iVar3 = num_cells(this), iVar2 < iVar3;
        local_24 = local_24 + 1) {
      local_2c = cell_id(this,local_24);
      bVar1 = S2CellId::is_valid(&local_2c);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        return false;
      }
      local_3c = cell_id(this,local_24 + -1);
      local_34 = S2CellId::range_max(&local_3c);
      local_4c = cell_id(this,local_24);
      local_44 = (uint64)S2CellId::range_min(&local_4c);
      bVar1 = operator>=(local_34,(S2CellId)local_44);
      if (bVar1) {
        return false;
      }
      local_7d = false;
      if (2 < local_24) {
        a = cell_id(this,local_24 + -3);
        b = cell_id(this,local_24 + -2);
        c = cell_id(this,local_24 + -1);
        d = cell_id(this,local_24);
        local_7d = AreSiblings(a,b,c,d);
      }
      if (local_7d != false) {
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool S2CellUnion::IsNormalized() const {
  if (num_cells() > 0 && !cell_id(0).is_valid()) return false;
  for (int i = 1; i < num_cells(); ++i) {
    if (!cell_id(i).is_valid()) return false;
    if (cell_id(i - 1).range_max() >= cell_id(i).range_min()) return false;
    if (i >= 3 && AreSiblings(cell_id(i - 3), cell_id(i - 2),
                              cell_id(i - 1), cell_id(i))) {
      return false;
    }
  }
  return true;
}